

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.h
# Opt level: O3

void __thiscall
haVoc::ScoredMoves::ScoredMoves
          (ScoredMoves *this,position *p,Movegen *m,vector<Move,_std::allocator<Move>_> *filters,
          Move *previous,Move *followup,Move *threat,node *stack,ScoreFunc score_lambda,Score cutoff
          )

{
  _Any_data local_50;
  code *local_40;
  
  (this->m_moves).super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_start = 0;
  this->m_end = 0;
  (this->m_moves).super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_moves).super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
  ::function((function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
              *)&local_50,
             (function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
              *)score_lambda.super__Function_base._M_functor._M_unused._0_8_);
  load_and_score(this,p,m,filters,previous,followup,threat,stack,(ScoreFunc *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  sort(this,(Score *)(score_lambda.super__Function_base._M_functor._M_pod_data + 8));
  return;
}

Assistant:

ScoredMoves(const position& p, Movegen* m, const std::vector<Move>& filters, const Move& previous, const Move& followup, const Move& threat, node* stack, ScoreFunc score_lambda, Score cutoff) {
			m_moves.clear();
			load_and_score(p, m, filters, previous, followup, threat, stack, score_lambda);
			sort(cutoff);
		}